

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void fly_apart_anim_done_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object local_38 [3];
  int local_1c;
  int i;
  Am_Object interp;
  Am_Object *cmd_local;
  
  interp.data = (Am_Object_Data *)cmd;
  pAVar1 = Am_Object::Get(cmd,0x171,0);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffe8,pAVar1);
  pAVar1 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,0x10e,0);
  local_1c = Am_Value::operator_cast_to_int(pAVar1);
  local_1c = local_1c + -1;
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffe8,0x10e,local_1c,0);
  if (local_1c == 0) {
    Am_Object::Am_Object(local_38,(Am_Object *)&stack0xffffffffffffffe8);
    Am_Stop_Animator(local_38);
    Am_Object::~Am_Object(local_38);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, fly_apart_anim_done, (Am_Object cmd))
{
  Am_Object interp = cmd.Get(Am_SAVED_OLD_OBJECT_OWNER);
  int i = (int)interp.Get(Am_WIGGLES) - 1;
  interp.Set(Am_WIGGLES, i);
  //std::cout << " Anim done, cnt = " << i <<std::endl <<std::flush;
  if (i == 0)
    Am_Stop_Animator(interp);
}